

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86.cpp
# Opt level: O3

void ncnn::rmsnorm(float *ptr,float *gamma_ptr,float eps,int elemcount,int elempack)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  float *pfVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar25 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128 _rms0;
  undefined1 auVar36 [32];
  undefined1 auVar34 [16];
  undefined1 auVar37 [32];
  float fVar40;
  float fVar43;
  undefined1 auVar38 [32];
  undefined1 auVar35 [28];
  float fVar41;
  float fVar42;
  undefined1 auVar39 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar60 [16];
  float fVar17;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar61 [32];
  
  auVar19 = in_ZMM6._0_16_;
  auVar25._4_60_ = in_register_00001204;
  auVar25._0_4_ = eps;
  auVar18 = auVar25._0_16_;
  uVar9 = elempack * elemcount;
  pfVar13 = ptr;
  if ((int)uVar9 < 8) {
    uVar14 = 0;
    auVar36 = SUB6432(ZEXT864(0),0);
  }
  else {
    uVar14 = uVar9 & 0x7ffffff8;
    auVar39 = ZEXT864(0);
    iVar15 = 7;
    do {
      fVar17 = *pfVar13 * *pfVar13;
      fVar26 = pfVar13[1] * pfVar13[1];
      fVar27 = pfVar13[2] * pfVar13[2];
      fVar28 = pfVar13[3] * pfVar13[3];
      fVar29 = pfVar13[4] * pfVar13[4];
      fVar30 = pfVar13[5] * pfVar13[5];
      fVar31 = pfVar13[6] * pfVar13[6];
      auVar25 = ZEXT3264(CONCAT428(pfVar13[7],
                                   CONCAT424(fVar31,CONCAT420(fVar30,CONCAT416(fVar29,CONCAT412(
                                                  fVar28,CONCAT48(fVar27,CONCAT44(fVar26,fVar17)))))
                                            )));
      auVar36._0_4_ = fVar17 + auVar39._0_4_;
      auVar36._4_4_ = fVar26 + auVar39._4_4_;
      auVar36._8_4_ = fVar27 + auVar39._8_4_;
      auVar36._12_4_ = fVar28 + auVar39._12_4_;
      auVar36._16_4_ = fVar29 + auVar39._16_4_;
      auVar36._20_4_ = fVar30 + auVar39._20_4_;
      auVar36._24_4_ = fVar31 + auVar39._24_4_;
      auVar36._28_4_ = pfVar13[7] + auVar39._28_4_;
      auVar39 = ZEXT3264(auVar36);
      pfVar13 = pfVar13 + 8;
      iVar15 = iVar15 + 8;
    } while (iVar15 < (int)uVar9);
  }
  auVar35 = auVar36._0_28_;
  auVar32 = ZEXT816(0) << 0x40;
  if ((int)(uVar14 | 3) < (int)uVar9) {
    auVar39 = ZEXT464(0) << 0x40;
    uVar12 = uVar14;
    do {
      fVar17 = *pfVar13 * *pfVar13;
      fVar26 = pfVar13[1] * pfVar13[1];
      fVar27 = pfVar13[2] * pfVar13[2];
      fVar28 = pfVar13[3] * pfVar13[3];
      auVar25 = ZEXT1664(CONCAT412(fVar28,CONCAT48(fVar27,CONCAT44(fVar26,fVar17))));
      auVar32._0_4_ = fVar17 + auVar39._0_4_;
      auVar32._4_4_ = fVar26 + auVar39._4_4_;
      auVar32._8_4_ = fVar27 + auVar39._8_4_;
      auVar32._12_4_ = fVar28 + auVar39._12_4_;
      auVar39 = ZEXT1664(auVar32);
      pfVar13 = pfVar13 + 4;
      uVar14 = uVar12 + 4;
      iVar15 = uVar12 + 7;
      uVar12 = uVar14;
    } while (iVar15 < (int)uVar9);
  }
  auVar49 = ZEXT816(0) << 0x40;
  if ((int)uVar14 < (int)uVar9) {
    uVar10 = CONCAT44(0,~uVar14 + uVar9);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar10;
    auVar21 = vpshufd_avx(auVar19,0x44);
    uVar16 = 0;
    auVar51._8_8_ = 0x8000000000000000;
    auVar51._0_8_ = 0x8000000000000000;
    auVar19 = vorps_avx(auVar21,auVar51);
    auVar49 = vorps_avx(auVar21,auVar51);
    auVar52 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
    auVar34 = vorps_avx(auVar21,auVar51);
    auVar25 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar39 = auVar25;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar16;
      auVar44 = vpshufd_avx(auVar44,0x44);
      auVar50._16_16_ = auVar44;
      auVar50._0_16_ = auVar44;
      auVar37 = vorps_avx(auVar50,_DAT_005a5c00);
      auVar50 = vorps_avx(auVar50,_DAT_005a5c20);
      auVar45._0_8_ = auVar50._16_8_ ^ 0x8000000000000000;
      auVar45._8_4_ = auVar50._24_4_;
      auVar45._12_4_ = auVar50._28_4_ ^ 0x80000000;
      auVar45 = vpcmpgtq_avx(auVar45,auVar19);
      auVar46._0_8_ = auVar50._0_8_ ^ 0x8000000000000000;
      auVar46._8_4_ = auVar50._8_4_;
      auVar46._12_4_ = auVar50._12_4_ ^ 0x80000000;
      auVar44 = vpcmpgtq_avx(auVar46,auVar49);
      auVar44 = vpackssdw_avx(auVar44,auVar45);
      auVar47._0_8_ = auVar37._16_8_ ^ 0x8000000000000000;
      auVar47._8_4_ = auVar37._24_4_;
      auVar47._12_4_ = auVar37._28_4_ ^ 0x80000000;
      auVar46 = vpcmpgtq_avx(auVar47,auVar19);
      auVar20._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
      auVar20._8_4_ = auVar37._8_4_;
      auVar20._12_4_ = auVar37._12_4_ ^ 0x80000000;
      auVar20 = vpcmpgtq_avx(auVar20,auVar34);
      auVar20 = vpackssdw_avx(auVar20,auVar46);
      auVar44 = vpackssdw_avx(auVar52 ^ auVar20,auVar52 ^ auVar44);
      auVar20 = vpmovsxwd_avx(auVar44);
      auVar44 = vpunpckhwd_avx(auVar44,auVar44);
      auVar23._16_16_ = auVar44;
      auVar23._0_16_ = auVar20;
      auVar23 = vmaskmovps_avx(auVar23,*(undefined1 (*) [32])(pfVar13 + uVar16));
      auVar60._0_4_ = auVar23._0_4_ * auVar23._0_4_ + auVar39._0_4_;
      auVar60._4_4_ = auVar23._4_4_ * auVar23._4_4_ + auVar39._4_4_;
      auVar60._8_4_ = auVar23._8_4_ * auVar23._8_4_ + auVar39._8_4_;
      auVar60._12_4_ = auVar23._12_4_ * auVar23._12_4_ + auVar39._12_4_;
      auVar61._16_4_ = auVar23._16_4_ * auVar23._16_4_ + auVar39._16_4_;
      auVar61._0_16_ = auVar60;
      auVar61._20_4_ = auVar23._20_4_ * auVar23._20_4_ + auVar39._20_4_;
      auVar61._24_4_ = auVar23._24_4_ * auVar23._24_4_ + auVar39._24_4_;
      auVar61._28_4_ = auVar23._28_4_ + auVar39._28_4_;
      uVar16 = uVar16 + 8;
      auVar25 = ZEXT3264(auVar61);
    } while ((uVar10 + 8 & 0xfffffffffffffff8) != uVar16);
    auVar19 = vorps_avx(auVar21,auVar51);
    auVar49._0_8_ = auVar50._0_8_ ^ 0x8000000000000000;
    auVar49._8_4_ = auVar50._8_4_;
    auVar49._12_4_ = auVar50._12_4_ ^ 0x80000000;
    auVar19 = vpcmpgtq_avx(auVar49,auVar19);
    auVar34 = vpackssdw_avx(auVar19,auVar45);
    auVar19 = vpcmpeqd_avx(auVar49,auVar49);
    auVar49 = vorps_avx(auVar21,auVar51);
    auVar52._8_4_ = auVar37._8_4_;
    auVar52._0_8_ = auVar37._0_8_ ^ 0x8000000000000000;
    auVar52._12_4_ = auVar37._12_4_ ^ 0x80000000;
    auVar49 = vpcmpgtq_avx(auVar52,auVar49);
    auVar49 = vpackssdw_avx(auVar49,auVar46);
    auVar49 = vblendvps_avx(auVar39._0_16_,auVar60,auVar49 ^ auVar19);
    auVar34 = vblendvps_avx(auVar39._16_16_,auVar61._16_16_,auVar34 ^ auVar19);
    auVar49 = vhaddps_avx(auVar34,auVar49);
    auVar49 = vhaddps_avx(auVar49,auVar49);
    auVar25 = ZEXT1664(auVar49);
    auVar49 = vhaddps_avx(auVar49,auVar49);
  }
  if (elempack == 8) {
    auVar18 = vshufps_avx(auVar18,auVar18,0);
    auVar34 = vshufps_avx(ZEXT416((uint)(1.0 / (float)elemcount)),
                          ZEXT416((uint)(1.0 / (float)elemcount)),0);
    auVar24._0_4_ = auVar36._0_4_ * auVar34._0_4_ + auVar18._0_4_;
    auVar24._4_4_ = auVar36._4_4_ * auVar34._4_4_ + auVar18._4_4_;
    auVar24._8_4_ = auVar36._8_4_ * auVar34._8_4_ + auVar18._8_4_;
    auVar24._12_4_ = auVar36._12_4_ * auVar34._12_4_ + auVar18._12_4_;
    auVar24._16_4_ = auVar36._16_4_ * auVar34._0_4_ + auVar18._0_4_;
    auVar24._20_4_ = auVar36._20_4_ * auVar34._4_4_ + auVar18._4_4_;
    auVar24._24_4_ = auVar36._24_4_ * auVar34._8_4_ + auVar18._8_4_;
    auVar24._28_4_ = auVar34._12_4_ + auVar18._12_4_;
    auVar25 = ZEXT3264(auVar24);
    auVar36 = vrsqrtps_avx(auVar24);
    auVar35 = auVar36._0_28_;
LAB_0059fbb7:
    bVar8 = false;
  }
  else {
    if (elempack != 1) {
      if (elempack == 4) {
        auVar18 = vshufps_avx(auVar18,auVar18,0);
        auVar34._0_4_ = 1.0 / (float)elemcount;
        auVar34._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar34 = vshufps_avx(auVar34,auVar34,0);
        auVar21._0_4_ =
             (auVar36._16_4_ + auVar36._0_4_ + auVar32._0_4_) * auVar34._0_4_ + auVar18._0_4_;
        auVar21._4_4_ =
             (auVar36._20_4_ + auVar36._4_4_ + auVar32._4_4_) * auVar34._4_4_ + auVar18._4_4_;
        auVar21._8_4_ =
             (auVar36._24_4_ + auVar36._8_4_ + auVar32._8_4_) * auVar34._8_4_ + auVar18._8_4_;
        auVar21._12_4_ =
             (auVar36._28_4_ + auVar36._12_4_ + auVar32._12_4_) * auVar34._12_4_ + auVar18._12_4_;
        auVar25 = ZEXT1664(auVar21);
        auVar32 = vrsqrtps_avx(auVar21);
        auVar37._16_16_ = auVar32;
        auVar37._0_16_ = auVar32;
        auVar35 = auVar37._0_28_;
        bVar7 = true;
        bVar8 = false;
        goto LAB_0059fbbc;
      }
      goto LAB_0059fbb7;
    }
    auVar18 = vhaddps_avx(auVar36._16_16_,auVar36._0_16_);
    auVar34 = vshufpd_avx(auVar32,auVar32,1);
    auVar18 = vhaddps_avx(auVar18,auVar18);
    auVar33._0_4_ = auVar34._0_4_ + auVar32._0_4_;
    auVar33._4_4_ = auVar34._4_4_ + auVar32._4_4_;
    auVar33._8_4_ = auVar34._8_4_ + auVar32._8_4_;
    auVar33._12_4_ = auVar34._12_4_ + auVar32._12_4_;
    auVar18 = vhaddps_avx(auVar18,auVar18);
    auVar32 = vmovshdup_avx(auVar33);
    auVar18 = ZEXT416((uint)((auVar18._0_4_ + auVar32._0_4_ + auVar33._0_4_ + auVar49._0_4_) /
                             (float)elemcount + eps));
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    auVar25 = ZEXT1664(auVar18);
    auVar49 = ZEXT416((uint)(1.0 / auVar18._0_4_));
    auVar32 = vshufps_avx(auVar49,auVar49,0);
    auVar38._16_16_ = auVar32;
    auVar38._0_16_ = auVar32;
    auVar35 = auVar38._0_28_;
    bVar8 = true;
  }
  bVar7 = false;
LAB_0059fbbc:
  fVar29 = auVar35._0_4_;
  fVar30 = auVar35._4_4_;
  fVar31 = auVar35._8_4_;
  fVar40 = auVar35._12_4_;
  fVar41 = auVar35._16_4_;
  fVar42 = auVar35._20_4_;
  fVar43 = auVar35._24_4_;
  fVar17 = auVar32._0_4_;
  fVar26 = auVar32._4_4_;
  fVar27 = auVar32._8_4_;
  fVar28 = auVar32._12_4_;
  if (gamma_ptr == (float *)0x0) {
    uVar14 = 0;
    if (7 < (int)uVar9) {
      uVar14 = uVar9 & 0x7ffffff8;
      iVar15 = 7;
      do {
        auVar39._0_4_ = fVar29 * *(float *)*(undefined1 (*) [32])ptr;
        auVar39._4_4_ = fVar30 * *(float *)((long)*(undefined1 (*) [32])ptr + 4);
        auVar39._8_4_ = fVar31 * *(float *)((long)*(undefined1 (*) [32])ptr + 8);
        auVar39._12_4_ = fVar40 * *(float *)((long)*(undefined1 (*) [32])ptr + 0xc);
        auVar39._16_4_ = fVar41 * *(float *)((long)*(undefined1 (*) [32])ptr + 0x10);
        auVar39._20_4_ = fVar42 * *(float *)((long)*(undefined1 (*) [32])ptr + 0x14);
        auVar39._28_36_ = auVar25._28_36_;
        auVar39._24_4_ = fVar43 * *(float *)((long)*(undefined1 (*) [32])ptr + 0x18);
        auVar25 = ZEXT3264(auVar39._0_32_);
        *(undefined1 (*) [32])ptr = auVar39._0_32_;
        ptr = (float *)((long)ptr + 0x20);
        iVar15 = iVar15 + 8;
      } while (iVar15 < (int)uVar9);
    }
    uVar12 = uVar14 | 3;
    auVar36 = _DAT_005a5c00;
    auVar37 = _DAT_005a5c20;
    while (_DAT_005a5c00 = auVar36, _DAT_005a5c20 = auVar37, (int)uVar12 < (int)uVar9) {
      fVar29 = *(float *)((long)*(undefined1 (*) [32])ptr + 4);
      fVar30 = *(float *)((long)*(undefined1 (*) [32])ptr + 8);
      fVar31 = *(float *)((long)*(undefined1 (*) [32])ptr + 0xc);
      *(float *)*(undefined1 (*) [32])ptr = fVar17 * *(float *)*(undefined1 (*) [32])ptr;
      *(float *)((long)*(undefined1 (*) [32])ptr + 4) = fVar26 * fVar29;
      *(float *)((long)*(undefined1 (*) [32])ptr + 8) = fVar27 * fVar30;
      *(float *)((long)*(undefined1 (*) [32])ptr + 0xc) = fVar28 * fVar31;
      ptr = (float *)((long)*(undefined1 (*) [32])ptr + 0x10);
      uVar12 = uVar14 + 7;
      uVar14 = uVar14 + 4;
      auVar36 = _DAT_005a5c00;
      auVar37 = _DAT_005a5c20;
    }
    if ((int)uVar14 < (int)uVar9) {
      uVar10 = CONCAT44(0,uVar9 + ~uVar14);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar10;
      auVar34 = vpshufd_avx(auVar18,0x44);
      auVar52 = vshufps_avx(auVar49,auVar49,0);
      uVar16 = 0;
      auVar48._8_8_ = 0x8000000000000000;
      auVar48._0_8_ = 0x8000000000000000;
      auVar18 = vorps_avx(auVar34,auVar48);
      auVar32 = vorps_avx(auVar34,auVar48);
      auVar49 = vpcmpeqd_avx(auVar19,auVar19);
      auVar19 = vorps_avx(auVar34,auVar48);
      do {
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar16;
        auVar34 = vpshufd_avx(auVar53,0x44);
        auVar55._16_16_ = auVar34;
        auVar55._0_16_ = auVar34;
        auVar50 = vorps_avx(auVar55,auVar36);
        auVar23 = vorps_avx(auVar55,auVar37);
        auVar58._0_8_ = auVar23._16_8_ ^ 0x8000000000000000;
        auVar58._8_4_ = auVar23._24_4_;
        auVar58._12_4_ = auVar23._28_4_ ^ 0x80000000;
        auVar34 = vpcmpgtq_avx(auVar58,auVar18);
        auVar54._0_8_ = auVar23._0_8_ ^ 0x8000000000000000;
        auVar54._8_4_ = auVar23._8_4_;
        auVar54._12_4_ = auVar23._12_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar54,auVar32);
        auVar34 = vpackssdw_avx(auVar21,auVar34);
        auVar59._0_8_ = auVar50._16_8_ ^ 0x8000000000000000;
        auVar59._8_4_ = auVar50._24_4_;
        auVar59._12_4_ = auVar50._28_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar59,auVar18);
        auVar57._0_8_ = auVar50._0_8_ ^ 0x8000000000000000;
        auVar57._8_4_ = auVar50._8_4_;
        auVar57._12_4_ = auVar50._12_4_ ^ 0x80000000;
        auVar51 = vpcmpgtq_avx(auVar57,auVar19);
        auVar21 = vpackssdw_avx(auVar51,auVar21);
        auVar34 = vpackssdw_avx(auVar21 ^ auVar49,auVar34 ^ auVar49);
        auVar21 = vpmovsxwd_avx(auVar34);
        auVar34 = vpunpckhwd_avx(auVar34,auVar34);
        auVar56._16_16_ = auVar34;
        auVar56._0_16_ = auVar21;
        auVar50 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])
                                          ((long)*(undefined1 (*) [32])ptr + uVar16 * 4));
        auVar5._4_4_ = auVar50._4_4_ * auVar52._4_4_;
        auVar5._0_4_ = auVar50._0_4_ * auVar52._0_4_;
        auVar5._8_4_ = auVar50._8_4_ * auVar52._8_4_;
        auVar5._12_4_ = auVar50._12_4_ * auVar52._12_4_;
        auVar5._16_4_ = auVar50._16_4_ * auVar52._0_4_;
        auVar5._20_4_ = auVar50._20_4_ * auVar52._4_4_;
        auVar5._24_4_ = auVar50._24_4_ * auVar52._8_4_;
        auVar5._28_4_ = auVar50._28_4_;
        auVar50 = vmaskmovps_avx(auVar56,auVar5);
        *(undefined1 (*) [32])((long)*(undefined1 (*) [32])ptr + uVar16 * 4) = auVar50;
        uVar16 = uVar16 + 8;
      } while ((uVar10 + 8 & 0xfffffffffffffff8) != uVar16);
    }
  }
  else {
    uVar14 = 0;
    if (7 < (int)uVar9 && elempack == 8) {
      iVar15 = 7;
      do {
        fVar1 = *gamma_ptr;
        auVar3._4_4_ = fVar30 * *(float *)(*(undefined1 (*) [32])ptr + 4) * fVar1;
        auVar3._0_4_ = fVar29 * *(float *)*(undefined1 (*) [32])ptr * fVar1;
        auVar3._8_4_ = fVar31 * *(float *)(*(undefined1 (*) [32])ptr + 8) * fVar1;
        auVar3._12_4_ = fVar40 * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * fVar1;
        auVar3._16_4_ = fVar41 * *(float *)(*(undefined1 (*) [32])ptr + 0x10) * fVar1;
        auVar3._20_4_ = fVar42 * *(float *)(*(undefined1 (*) [32])ptr + 0x14) * fVar1;
        auVar3._24_4_ = fVar43 * *(float *)(*(undefined1 (*) [32])ptr + 0x18) * fVar1;
        auVar3._28_4_ = fVar1;
        auVar25 = ZEXT3264(auVar3);
        *(undefined1 (*) [32])ptr = auVar3;
        ptr = (float *)((long)ptr + 0x20);
        gamma_ptr = gamma_ptr + 1;
        iVar15 = iVar15 + 8;
        uVar14 = uVar9;
      } while (iVar15 < (int)uVar9);
    }
    if (bVar7) {
      uVar12 = uVar14 | 7;
      while ((int)uVar12 < (int)uVar9) {
        fVar1 = *gamma_ptr;
        fVar2 = gamma_ptr[1];
        auVar4._4_4_ = fVar30 * *(float *)(*(undefined1 (*) [32])ptr + 4) * fVar1;
        auVar4._0_4_ = fVar29 * *(float *)*(undefined1 (*) [32])ptr * fVar1;
        auVar4._8_4_ = fVar31 * *(float *)(*(undefined1 (*) [32])ptr + 8) * fVar1;
        auVar4._12_4_ = fVar40 * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * fVar1;
        auVar4._16_4_ = fVar41 * *(float *)(*(undefined1 (*) [32])ptr + 0x10) * fVar2;
        auVar4._20_4_ = fVar42 * *(float *)(*(undefined1 (*) [32])ptr + 0x14) * fVar2;
        auVar4._24_4_ = fVar43 * *(float *)(*(undefined1 (*) [32])ptr + 0x18) * fVar2;
        auVar4._28_4_ = fVar2;
        auVar25 = ZEXT3264(auVar4);
        *(undefined1 (*) [32])ptr = auVar4;
        ptr = (float *)((long)ptr + 0x20);
        gamma_ptr = gamma_ptr + 2;
        uVar12 = uVar14 + 0xf;
        uVar14 = uVar14 + 8;
      }
      uVar12 = uVar14 | 3;
      while ((int)uVar12 < (int)uVar9) {
        fVar1 = *gamma_ptr;
        auVar22._0_4_ = fVar17 * *(float *)*(undefined1 (*) [32])ptr * fVar1;
        auVar22._4_4_ = fVar26 * *(float *)(*(undefined1 (*) [32])ptr + 4) * fVar1;
        auVar22._8_4_ = fVar27 * *(float *)(*(undefined1 (*) [32])ptr + 8) * fVar1;
        auVar22._12_4_ = fVar28 * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * fVar1;
        auVar25 = ZEXT1664(auVar22);
        *(undefined1 (*) [16])*(undefined1 (*) [32])ptr = auVar22;
        ptr = (float *)(*(undefined1 (*) [32])ptr + 0x10);
        gamma_ptr = gamma_ptr + 1;
        uVar12 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
    }
    if (bVar8) {
      iVar15 = uVar14 + 7;
      while (iVar15 < (int)uVar9) {
        auVar6._4_4_ = fVar30 * *(float *)(*(undefined1 (*) [32])ptr + 4) * gamma_ptr[1];
        auVar6._0_4_ = fVar29 * *(float *)*(undefined1 (*) [32])ptr * *gamma_ptr;
        auVar6._8_4_ = fVar31 * *(float *)(*(undefined1 (*) [32])ptr + 8) * gamma_ptr[2];
        auVar6._12_4_ = fVar40 * *(float *)(*(undefined1 (*) [32])ptr + 0xc) * gamma_ptr[3];
        auVar6._16_4_ = fVar41 * *(float *)(*(undefined1 (*) [32])ptr + 0x10) * gamma_ptr[4];
        auVar6._20_4_ = fVar42 * *(float *)(*(undefined1 (*) [32])ptr + 0x14) * gamma_ptr[5];
        auVar6._24_4_ = fVar43 * *(float *)(*(undefined1 (*) [32])ptr + 0x18) * gamma_ptr[6];
        auVar6._28_4_ = auVar25._28_4_;
        auVar25 = ZEXT3264(auVar6);
        *(undefined1 (*) [32])ptr = auVar6;
        ptr = (float *)((long)ptr + 0x20);
        gamma_ptr = gamma_ptr + 8;
        iVar15 = uVar14 + 0xf;
        uVar14 = uVar14 + 8;
      }
      iVar15 = uVar14 + 3;
      while (iVar15 < (int)uVar9) {
        fVar29 = *(float *)(*(undefined1 (*) [32])ptr + 4);
        fVar30 = *(float *)(*(undefined1 (*) [32])ptr + 8);
        fVar31 = *(float *)(*(undefined1 (*) [32])ptr + 0xc);
        fVar40 = gamma_ptr[1];
        fVar41 = gamma_ptr[2];
        fVar42 = gamma_ptr[3];
        *(float *)*(undefined1 (*) [32])ptr =
             fVar17 * *(float *)*(undefined1 (*) [32])ptr * *gamma_ptr;
        *(float *)(*(undefined1 (*) [32])ptr + 4) = fVar26 * fVar29 * fVar40;
        *(float *)(*(undefined1 (*) [32])ptr + 8) = fVar27 * fVar30 * fVar41;
        *(float *)(*(undefined1 (*) [32])ptr + 0xc) = fVar28 * fVar31 * fVar42;
        ptr = (float *)(*(undefined1 (*) [32])ptr + 0x10);
        gamma_ptr = gamma_ptr + 4;
        iVar15 = uVar14 + 7;
        uVar14 = uVar14 + 4;
      }
    }
    if (uVar9 - uVar14 != 0 && (int)uVar14 <= (int)uVar9) {
      lVar11 = 0;
      do {
        *(float *)(*(undefined1 (*) [32])ptr + lVar11 * 4) =
             auVar49._0_4_ * *(float *)(*(undefined1 (*) [32])ptr + lVar11 * 4) * gamma_ptr[lVar11];
        lVar11 = lVar11 + 1;
      } while (uVar9 - uVar14 != (int)lVar11);
    }
  }
  return;
}

Assistant:

static void rmsnorm(float* ptr, const float* gamma_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _rms_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _rms_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _rms = _mm_set1_ps(0.f);
#endif // __SSE2__
    float rms = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _rms_avx512 = _mm512_fmadd_ps(_p, _p, _rms_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _rms_avx = _mm256_comp_fmadd_ps(_p, _p, _rms_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _rms = _mm_comp_fmadd_ps(_p, _p, _rms);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            rms += ptr0[0] * ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);

        _rms_avx512 = _mm512_div_ps(_rms_avx512, _elemcount);
        _rms_avx512 = _mm512_add_ps(_rms_avx512, _eps);

        __m256 _rms0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 0));
        __m256 _rms1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_rms_avx512, 1));
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms0), _rms1, 1);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);

        _rms_avx = _mm256_div_ps(_rms_avx, _elemcount);
        _rms_avx = _mm256_add_ps(_rms_avx, _eps);

        _rms_avx = _mm256_rsqrt_ps(_rms_avx);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _rms0 = _mm512_castps512_ps256(_rms_avx512);
            __m256 _rms1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_rms_avx512), 1));
            _rms_avx = _mm256_add_ps(_rms_avx, _rms0);
            _rms_avx = _mm256_add_ps(_rms_avx, _rms1);
        }
#endif // __AVX512F__
        {
            __m128 _rms0 = _mm256_castps256_ps128(_rms_avx);
            __m128 _rms1 = _mm256_extractf128_ps(_rms_avx, 1);
            _rms = _mm_add_ps(_rms, _rms0);
            _rms = _mm_add_ps(_rms, _rms1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);

        _rms = _mm_div_ps(_rms, _elemcount);
        _rms = _mm_add_ps(_rms, _eps);

        _rms = _mm_rsqrt_ps(_rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        rms += _mm512_comp_reduce_add_ps(_rms_avx512);
#endif // __AVX512F__
        rms += _mm256_reduce_add_ps(_rms_avx);
#endif // __AVX__
        rms += _mm_reduce_add_ps(_rms);
#endif // __SSE2__

        rms = 1.f / sqrtf(rms / elemcount + eps);
#if __SSE2__
        _rms = _mm_set1_ps(rms);
#if __AVX__
        _rms_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_rms), _rms, 1);
#if __AVX512F__
        _rms_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_rms_avx), _rms_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                _p = _mm512_mul_ps(_p, _rms_avx512);
                _p = _mm512_mul_ps(_p, _gamma);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                _p = _mm256_mul_ps(_p, _rms_avx);
                _p = _mm256_mul_ps(_p, _gamma);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                _p = _mm_mul_ps(_p, _rms);
                _p = _mm_mul_ps(_p, _gamma);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * rms) * gamma_ptr[0];
            ptr++;
            gamma_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_mul_ps(_p, _rms_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_mul_ps(_p, _rms_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_mul_ps(_p, _rms);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * rms;
            ptr++;
        }
    }
}